

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlXPathCompExprPtr xmlXPathCtxtCompile(xmlXPathContextPtr ctxt,xmlChar *str)

{
  int iVar1;
  xmlXPathCompExprPtr pxVar2;
  xmlXPathParserContextPtr ctxt_00;
  xmlChar *pxVar3;
  
  pxVar2 = xmlXPathTryStreamCompile(ctxt,str);
  if (pxVar2 == (xmlXPathCompExprPtr)0x0) {
    xmlInitParser();
    ctxt_00 = xmlXPathNewParserContext(str,ctxt);
    if (ctxt_00 != (xmlXPathParserContextPtr)0x0) {
      if (ctxt != (xmlXPathContextPtr)0x0) {
        ctxt->depth = 0;
      }
      xmlXPathCompileExpr(ctxt_00,1);
      if (ctxt_00->error == 0) {
        if (*ctxt_00->cur == '\0') {
          pxVar2 = ctxt_00->comp;
          if ((1 < pxVar2->nbStep) && (iVar1 = pxVar2->last, -1 < (long)iVar1)) {
            if (ctxt != (xmlXPathContextPtr)0x0) {
              ctxt->depth = 0;
            }
            xmlXPathOptimizeExpression(ctxt_00,pxVar2->steps + iVar1);
          }
          ctxt_00->comp = (xmlXPathCompExprPtr)0x0;
          xmlXPathFreeParserContext(ctxt_00);
          pxVar3 = xmlStrdup(str);
          pxVar2->expr = pxVar3;
          return pxVar2;
        }
        xmlXPathErr(ctxt_00,7);
      }
      xmlXPathFreeParserContext(ctxt_00);
    }
    pxVar2 = (xmlXPathCompExprPtr)0x0;
  }
  return pxVar2;
}

Assistant:

xmlXPathCompExprPtr
xmlXPathCtxtCompile(xmlXPathContextPtr ctxt, const xmlChar *str) {
    xmlXPathParserContextPtr pctxt;
    xmlXPathCompExprPtr comp;

#ifdef XPATH_STREAMING
    comp = xmlXPathTryStreamCompile(ctxt, str);
    if (comp != NULL)
        return(comp);
#endif

    xmlInitParser();

    pctxt = xmlXPathNewParserContext(str, ctxt);
    if (pctxt == NULL)
        return NULL;
    if (ctxt != NULL)
        ctxt->depth = 0;
    xmlXPathCompileExpr(pctxt, 1);

    if( pctxt->error != XPATH_EXPRESSION_OK )
    {
        xmlXPathFreeParserContext(pctxt);
        return(NULL);
    }

    if (*pctxt->cur != 0) {
	/*
	 * aleksey: in some cases this line prints *second* error message
	 * (see bug #78858) and probably this should be fixed.
	 * However, we are not sure that all error messages are printed
	 * out in other places. It's not critical so we leave it as-is for now
	 */
	xmlXPatherror(pctxt, __FILE__, __LINE__, XPATH_EXPR_ERROR);
	comp = NULL;
    } else {
	comp = pctxt->comp;
	if ((comp->nbStep > 1) && (comp->last >= 0)) {
            if (ctxt != NULL)
                ctxt->depth = 0;
	    xmlXPathOptimizeExpression(pctxt, &comp->steps[comp->last]);
	}
	pctxt->comp = NULL;
    }
    xmlXPathFreeParserContext(pctxt);

    if (comp != NULL) {
	comp->expr = xmlStrdup(str);
#ifdef DEBUG_EVAL_COUNTS
	comp->string = xmlStrdup(str);
	comp->nb = 0;
#endif
    }
    return(comp);
}